

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DistItemSyntax::setChild(DistItemSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  DistWeightSyntax *pDVar2;
  
  pSVar1 = TokenOrSyntax::node(&child);
  if (index == 0) {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->range).ptr = (ExpressionSyntax *)pSVar1;
  }
  else {
    if (pSVar1 == (SyntaxNode *)0x0) {
      pDVar2 = (DistWeightSyntax *)0x0;
    }
    else {
      pDVar2 = (DistWeightSyntax *)TokenOrSyntax::node(&child);
    }
    this->weight = pDVar2;
  }
  return;
}

Assistant:

void DistItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: range = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: weight = child.node() ? &child.node()->as<DistWeightSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}